

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

bool __thiscall PS_stream_pack::deserialize(PS_stream_pack *this,uint8_t *buffer,int buf_size)

{
  bool bVar1;
  uint uVar2;
  BitStreamReader bitReader;
  
  this->m_pts = 0;
  bitReader.super_BitStream.m_totalBits = 0;
  bitReader.m_curVal = 0;
  bitReader.m_bitLeft = 0;
  bitReader.super_BitStream.m_buffer = (uint *)0x0;
  bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer(&bitReader,buffer,buffer + buf_size);
  uVar2 = BitStreamReader::getBits(&bitReader,2);
  if (uVar2 == 1) {
    uVar2 = BitStreamReader::getBits(&bitReader,3);
    this->m_pts = (ulong)(uVar2 << 0x1e);
    bVar1 = BitStreamReader::getBit(&bitReader);
    if (bVar1) {
      uVar2 = BitStreamReader::getBits(&bitReader,0xf);
      this->m_pts = this->m_pts + (ulong)(uVar2 << 0xf);
      bVar1 = BitStreamReader::getBit(&bitReader);
      if (bVar1) {
        uVar2 = BitStreamReader::getBits(&bitReader,0xf);
        this->m_pts = this->m_pts + (ulong)uVar2;
        bVar1 = BitStreamReader::getBit(&bitReader);
        if (bVar1) {
          uVar2 = BitStreamReader::getBits(&bitReader,9);
          this->m_pts_ext = uVar2;
          bVar1 = BitStreamReader::getBit(&bitReader);
          if (bVar1) {
            uVar2 = BitStreamReader::getBits(&bitReader,0x16);
            this->m_program_mux_rate = uVar2 * 400;
            uVar2 = BitStreamReader::getBits(&bitReader,2);
            if (uVar2 == 3) {
              BitStreamReader::skipBits(&bitReader,5);
              uVar2 = BitStreamReader::getBits(&bitReader,3);
              this->m_pack_stuffing_length = uVar2;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool PS_stream_pack::deserialize(uint8_t* buffer, const int buf_size)
{
    try
    {
        m_pts = 0;
        BitStreamReader bitReader{};
        bitReader.setBuffer(buffer, buffer + buf_size);
        if (bitReader.getBits(2) != 1)
            return false;  // 0b01 required
        m_pts = bitReader.getBits(3) << 30;
        if (bitReader.getBit() != 1)
            return false;
        m_pts += bitReader.getBits(15) << 15;
        if (bitReader.getBit() != 1)
            return false;
        m_pts += bitReader.getBits(15);
        if (bitReader.getBit() != 1)
            return false;
        m_pts_ext = bitReader.getBits(9);
        if (bitReader.getBit() != 1)
            return false;
        m_program_mux_rate = bitReader.getBits(22) * 50 * 8;  // convert to bits/sec
        if (bitReader.getBits(2) != 3)
            return false;
        bitReader.skipBits(5);  // reserved
        m_pack_stuffing_length = bitReader.getBits(3);
        return true;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return false;
    }
}